

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O3

size_t zmCreateMont_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong n;
  
  n = no + 7 >> 3;
  sVar1 = zzMod_deep(n,n);
  sVar2 = zzMod_deep(n * 2,n);
  sVar3 = zzRedMont_deep(n);
  sVar4 = zmMulMont_deep(n);
  sVar5 = zmSqrMont_deep(n);
  sVar6 = zzAlmostInvMod_deep(n);
  sVar7 = zmDivMont_deep(n);
  sVar1 = utilMax(7,sVar1,sVar2 + n * 0x10,n * 0x10 + sVar3,sVar4,sVar5,sVar6,sVar7);
  return sVar1;
}

Assistant:

size_t zmCreateMont_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(7,
		zzMod_deep(n, n),
		zmFromMont_deep(n),
		zmToMont_deep(n),
		zmMulMont_deep(n),
		zmSqrMont_deep(n),
		zmInvMont_deep(n),
		zmDivMont_deep(n));
}